

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

string * __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
::to_string_abi_cxx11_
          (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           *this,int level)

{
  undefined8 uVar1;
  pointer peVar2;
  conv_flags extraout_var;
  uint in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  type tVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_stack_00000038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sbuf;
  string *s;
  string *in_stack_fffffffffffffe88;
  assertion_error *in_stack_fffffffffffffe90;
  conv_flags flags;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  size_t in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  string *__s;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  char *local_c0;
  conv_errc local_b8;
  string local_b0 [12];
  jsonpath_token_kind in_stack_ffffffffffffff5c;
  string local_90 [32];
  string local_70 [38];
  undefined1 local_4a;
  undefined1 local_15;
  uint local_14;
  
  local_15 = 0;
  __s = in_RDI;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)in_RDI);
  switch(*(undefined4 *)in_RSI) {
  case 0:
    if (0 < (int)local_14) {
      std::__cxx11::string::append((char *)in_RDI);
      std::__cxx11::string::append((ulong)in_RDI,(char)local_14 * '\x02');
    }
    std::__cxx11::string::append((char *)in_RDI);
    break;
  case 1:
    if (0 < (int)local_14) {
      std::__cxx11::string::append((char *)in_RDI);
      std::__cxx11::string::append((ulong)in_RDI,(char)local_14 * '\x02');
    }
    std::__cxx11::string::append((char *)in_RDI);
    break;
  case 2:
    peVar2 = std::
             unique_ptr<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_>_>
             ::operator->((unique_ptr<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>_>_>
                           *)0x6f5119);
    (*peVar2->_vptr_expression_base[3])(local_90,peVar2,(ulong)local_14);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_90);
    break;
  default:
    if (0 < (int)local_14) {
      std::__cxx11::string::append((char *)in_RDI);
      std::__cxx11::string::append((ulong)in_RDI,(char)local_14 * '\x02');
    }
    std::__cxx11::string::append((char *)in_RDI);
    detail::to_string_abi_cxx11_(in_stack_ffffffffffffff5c);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_120);
    break;
  case 0xd:
    if (0 < (int)local_14) {
      std::__cxx11::string::append((char *)in_RDI);
      std::__cxx11::string::append((ulong)in_RDI,(char)local_14 * '\x02');
    }
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::to_string_abi_cxx11_
              (in_stack_00000038);
    std::__cxx11::string::data();
    flags = extraout_var;
    std::__cxx11::string::size();
    tVar3 = unicode_traits::convert<char,std::__cxx11::string>
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),flags);
    local_c0 = tVar3.ptr;
    local_b8 = tVar3.ec;
    std::__cxx11::string::~string(local_b0);
    break;
  case 0xe:
    if (in_RSI->_M_string_length == 0) {
      local_4a = 1;
      uVar1 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RSI,(char *)__s,(allocator<char> *)in_RDI);
      assertion_error::assertion_error(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      local_4a = 0;
      __cxa_throw(uVar1,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    (**(code **)(*(long *)in_RSI->_M_string_length + 0x28))
              (local_70,(long *)in_RSI->_M_string_length,local_14);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_70);
    break;
  case 0xf:
    (**(code **)(*(long *)in_RSI->_M_string_length + 0x18))
              (local_100,(long *)in_RSI->_M_string_length,local_14);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_100);
    break;
  case 0x11:
    if (0 < (int)local_14) {
      std::__cxx11::string::append((char *)in_RDI);
      std::__cxx11::string::append((ulong)in_RDI,(char)local_14 * '\x02');
    }
    std::__cxx11::string::append((char *)in_RDI);
    break;
  case 0x13:
    (**(code **)(*(long *)in_RSI->_M_string_length + 0x18))
              (local_e0,(long *)in_RSI->_M_string_length,local_14);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_e0);
  }
  return __s;
}

Assistant:

std::string to_string(int level) const
        {
            std::string s;
            switch (token_kind_)
            {
                case jsonpath_token_kind::root_node:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("root node");
                    break;
                case jsonpath_token_kind::current_node:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("current node");
                    break;
                case jsonpath_token_kind::argument:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("argument");
                    break;
                case jsonpath_token_kind::selector:
                    JSONCONS_ASSERT(selector_ != nullptr);
                    s.append(selector_->to_string(level));
                    break;
                case jsonpath_token_kind::expression:
                    s.append(expression_->to_string(level));
                    break;
                case jsonpath_token_kind::literal:
                {
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    auto sbuf = value_.to_string();
                    unicode_traits::convert(sbuf.data(), sbuf.size(), s);
                    break;
                }
                case jsonpath_token_kind::binary_operator:
                    s.append(binary_operator_->to_string(level));
                    break;
                case jsonpath_token_kind::function:
                    s.append(function_->to_string(level));
                    break;
                default:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("token kind: ");
                    s.append(jsoncons::jsonpath::detail::to_string(token_kind_));
                    break;
            }
            //s.append("\n");
            return s;
        }